

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::drawTest
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this,GLint program
          ,int binding)

{
  int height;
  PrimitiveType expected;
  RenderContext *context;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  int *piVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureFormat TVar6;
  Surface renderedFrame;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Surface local_80;
  String local_68;
  Vector<float,_4> local_48;
  
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  lVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var,iVar2) + 8) + 0x18))();
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  piVar5 = (int *)(**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar2) + 8) + 0x20))();
  iVar2 = *piVar5;
  height = piVar5[1];
  tcu::Surface::Surface(&local_80,iVar2,height);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])(this);
  if (iVar3 == 2) {
    deAssertFail("getStage() != ComputeShader",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cLayoutBindingTests.cpp"
                 ,0x4e9);
  }
  (**(code **)(lVar4 + 0x1a00))(0,0,iVar2,height);
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar4 + 0x188))(0x4000);
  (**(code **)(lVar4 + 0x1680))(program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
            (this,(ulong)(uint)binding);
  if (((char)drawTest(int,int)::vertexArrays == '\0') &&
     (iVar2 = __cxa_guard_acquire(&drawTest(int,int)::vertexArrays), iVar2 != 0)) {
    local_a8._0_8_ = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"inPosition","");
    glu::va::Float(drawTest::vertexArrays,(string *)local_a8,2,4,0,drawTest::position);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
    }
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&drawTest(int,int)::vertexArrays);
  }
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  local_a8._0_8_ = &DAT_600000001;
  local_a8._8_4_ = 1;
  local_98._M_allocated_capacity = (size_type)drawTest::quadIndices;
  glu::draw(*(RenderContext **)(CONCAT44(extraout_var_01,iVar2) + 8),program,1,
            drawTest::vertexArrays,(PrimitiveList *)local_a8,(DrawUtilCallback *)0x0);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  context = *(RenderContext **)(CONCAT44(extraout_var_02,iVar2) + 8);
  local_68._M_dataplus._M_p = (pointer)0x300000008;
  if ((PrimitiveType *)local_80.m_pixels.m_cap != (PrimitiveType *)0x0) {
    local_80.m_pixels.m_cap = (size_t)local_80.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_a8,(TextureFormat *)&local_68,local_80.m_width,
             local_80.m_height,1,(void *)local_80.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_a8);
  expected = *local_80.m_pixels.m_ptr;
  tcu::RGBA::RGBA((RGBA *)local_a8,&this->m_expectedColor);
  uVar1 = local_a8._0_4_;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
            (this,(ulong)(uint)binding);
  if (expected == uVar1) {
    local_a8._8_8_ = 0;
    local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    local_a8._0_8_ = &local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,&local_98,&local_98);
    local_68.field_2._M_allocated_capacity = local_98._M_allocated_capacity;
    TVar6 = (TextureFormat)local_a8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ == &local_98) goto LAB_00bd6d69;
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"drawTest failed","");
    local_48.m_data._0_8_ = *(undefined8 *)(this->m_expectedColor).m_data;
    local_48.m_data._8_8_ = *(undefined8 *)((this->m_expectedColor).m_data + 2);
    generateLog<tcu::Vector<float,4>,unsigned_int>
              ((String *)local_a8,this,&local_68,&local_48,expected);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_a8._0_8_,
               (undefined1 *)(local_a8._8_8_ + local_a8._0_8_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
    }
    TVar6 = (TextureFormat)local_68._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_00bd6d69;
  }
  operator_delete((void *)TVar6,local_68.field_2._M_allocated_capacity + 1);
LAB_00bd6d69:
  tcu::Surface::~Surface(&local_80);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::drawTest(glw::GLint program, int binding)
{
	const glw::Functions&	GL			  = getContext().getRenderContext().getFunctions();
	const tcu::RenderTarget& renderTarget = getContext().getRenderContext().getRenderTarget();
	glw::GLuint				 viewportW	= renderTarget.getWidth();
	glw::GLuint				 viewportH	= renderTarget.getHeight();
	tcu::Surface			 renderedFrame(viewportW, viewportH);
	bool					 passed = true;

	DE_TEST_ASSERT(getStage() != ComputeShader);

	GL.viewport(0, 0, viewportW, viewportH);
	GL.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GL.clear(GL_COLOR_BUFFER_BIT);

	static const float position[] = {
		-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
	};
	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	GL.useProgram(program);

	bind(binding);

	static const glu::VertexArrayBinding vertexArrays[] = {
		glu::va::Float("inPosition", 2, 4, 0, &position[0]),
	};
	glu::draw(getContext().getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

	glu::readPixels(getContext().getRenderContext(), 0, 0, renderedFrame.getAccess());

	tcu::RGBA pixel = renderedFrame.getPixel(0, 0);

	passed = (pixel == tcu::RGBA(m_expectedColor));

	unbind(binding);

	if (!passed)
	{
		return LayoutBindingTestResult(passed,
									   generateLog(String("drawTest failed"), m_expectedColor, pixel.getPacked()));
	}

	return true;
}